

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall cmQtAutoGenInitializer::AddCleanFile(cmQtAutoGenInitializer *this,string *fileName)

{
  cmTarget *this_00;
  string *value;
  optional<cmListFileBacktrace> local_68;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *fileName_local;
  cmQtAutoGenInitializer *this_local;
  
  this_00 = this->GenTarget->Target;
  local_18 = fileName;
  fileName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ADDITIONAL_CLEAN_FILES",&local_39);
  value = local_18;
  std::optional<cmListFileBacktrace>::optional();
  cmTarget::AppendProperty(this_00,&local_38,value,&local_68,false);
  std::optional<cmListFileBacktrace>::~optional(&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddCleanFile(std::string const& fileName)
{
  this->GenTarget->Target->AppendProperty("ADDITIONAL_CLEAN_FILES", fileName);
}